

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_extraction.cc
# Opt level: O0

void __thiscall
sptk::SpectrumExtraction::SpectrumExtraction
          (SpectrumExtraction *this,int fft_length,int frame_shift,double sampling_rate,
          bool f0_refinement,Algorithms algorithm)

{
  void *pvVar1;
  undefined1 in_CL;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  int in_R8D;
  undefined8 in_XMM0_Qa;
  undefined1 in_stack_ffffffffffffffdf;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar2;
  
  uVar2 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  *in_RDI = &PTR__SpectrumExtraction_00147808;
  if (in_R8D == 0) {
    pvVar1 = operator_new(0x20);
    SpectrumExtractionByWorld::SpectrumExtractionByWorld
              ((SpectrumExtractionByWorld *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_XMM0_Qa >> 0x20)
               ,(int)in_XMM0_Qa,(double)CONCAT44(uVar2,in_R8D),(bool)in_stack_ffffffffffffffdf);
    in_RDI[1] = pvVar1;
  }
  else {
    in_RDI[1] = 0;
  }
  return;
}

Assistant:

SpectrumExtraction::SpectrumExtraction(
    int fft_length, int frame_shift, double sampling_rate, bool f0_refinement,
    SpectrumExtraction::Algorithms algorithm) {
  switch (algorithm) {
    case kWorld: {
      spectrum_extraction_ = new SpectrumExtractionByWorld(
          fft_length, frame_shift, sampling_rate, f0_refinement);
      break;
    }
    default: {
      spectrum_extraction_ = NULL;
      break;
    }
  }
}